

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_v_predictor_16x4_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  uint3 uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  unkuint9 Var9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [13];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  uint8_t *puVar17;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short sVar35;
  short sVar38;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ushort uVar39;
  ushort uVar40;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  undefined1 auVar41 [16];
  ushort uVar48;
  ushort uVar49;
  ushort uVar54;
  ushort uVar55;
  int5 iVar50;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  undefined1 auVar72 [16];
  ushort uVar84;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  undefined1 auVar51 [12];
  undefined1 auVar52 [14];
  undefined1 auVar53 [16];
  
  auVar18 = pshuflw(ZEXT116(left_column[3]),ZEXT116(left_column[3]),0);
  sVar35 = auVar18._0_2_;
  sVar38 = auVar18._2_2_;
  auVar18 = *(undefined1 (*) [16])top_row;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar18._0_13_;
  auVar2[0xe] = auVar18[7];
  auVar3[0xc] = auVar18[6];
  auVar3._0_12_ = auVar18._0_12_;
  auVar3._13_2_ = auVar2._13_2_;
  auVar4[0xb] = 0;
  auVar4._0_11_ = auVar18._0_11_;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5[10] = auVar18[5];
  auVar5._0_10_ = auVar18._0_10_;
  auVar5._11_4_ = auVar4._11_4_;
  auVar6[9] = 0;
  auVar6._0_9_ = auVar18._0_9_;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = auVar18[4];
  auVar7._0_8_ = auVar18._0_8_;
  auVar7._9_6_ = auVar6._9_6_;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = auVar7._8_7_;
  Var9 = CONCAT81(SUB158(auVar8 << 0x40,7),auVar18[3]);
  auVar12._9_6_ = 0;
  auVar12._0_9_ = Var9;
  auVar10._1_10_ = SUB1510(auVar12 << 0x30,5);
  auVar10[0] = auVar18[2];
  auVar13._11_4_ = 0;
  auVar13._0_11_ = auVar10;
  auVar11._1_12_ = SUB1512(auVar13 << 0x20,3);
  auVar11[0] = auVar18[1];
  auVar19._0_2_ = CONCAT11(0,auVar18[0]);
  auVar19._2_13_ = auVar11;
  auVar19[0xf] = 0;
  auVar26._0_2_ = CONCAT11(0,auVar18[8]);
  bVar28 = auVar18[9];
  auVar26[2] = bVar28;
  auVar26[3] = 0;
  bVar29 = auVar18[10];
  auVar26[4] = bVar29;
  auVar26[5] = 0;
  bVar30 = auVar18[0xb];
  auVar26[6] = bVar30;
  auVar26[7] = 0;
  bVar31 = auVar18[0xc];
  auVar26[8] = bVar31;
  auVar26[9] = 0;
  bVar32 = auVar18[0xd];
  auVar26[10] = bVar32;
  auVar26[0xb] = 0;
  bVar33 = auVar18[0xe];
  auVar26[0xc] = bVar33;
  auVar26[0xd] = 0;
  bVar34 = auVar18[0xf];
  auVar26[0xe] = bVar34;
  auVar26[0xf] = 0;
  auVar14[10] = 0;
  auVar14._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar14[0xb] = auVar18[5];
  auVar15[9] = auVar18[4];
  auVar15._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar15._10_2_ = auVar14._10_2_;
  auVar16._9_3_ = auVar15._9_3_;
  auVar16._0_9_ = (unkuint9)0;
  auVar72 = ZEXT516(CONCAT41(auVar16._8_4_,auVar18[3])) << 0x38;
  auVar37._1_10_ = auVar72._6_10_;
  auVar37[0] = auVar18[2];
  auVar37._11_5_ = 0;
  auVar27._1_12_ = SUB1612(auVar37 << 0x28,4);
  auVar27[0] = auVar18[1];
  auVar27._13_3_ = 0;
  sVar20 = auVar11._0_2_;
  sVar21 = auVar10._0_2_;
  sVar22 = (short)Var9;
  sVar23 = auVar7._8_2_;
  sVar24 = auVar5._10_2_;
  sVar25 = auVar3._12_2_;
  uVar39 = auVar2._13_2_ >> 8;
  uVar1 = CONCAT12(bVar28,(ushort)auVar18[8]);
  iVar50 = (uint5)uVar1 << 8;
  auVar51._0_10_ = CONCAT19(bVar31,(unkuint9)bVar30 << 0x38);
  auVar51[10] = 0;
  auVar51[0xb] = bVar32;
  auVar52[0xc] = 0;
  auVar52._0_12_ = auVar51;
  auVar52[0xd] = bVar33;
  auVar53[0xe] = 0;
  auVar53._0_14_ = auVar52;
  auVar53[0xf] = bVar34;
  uVar40 = (ushort)bVar28;
  uVar42 = (ushort)bVar29;
  uVar43 = (ushort)bVar30;
  uVar44 = (ushort)bVar31;
  uVar45 = (ushort)bVar32;
  uVar46 = (ushort)bVar33;
  uVar47 = (ushort)bVar34;
  auVar36._0_2_ = sVar35 + 0x80;
  auVar36._2_2_ = sVar38 * 0x6b + 0x80;
  auVar36._4_2_ = sVar35 * 0xab + 0x80;
  auVar36._6_2_ = sVar38 * 0xc0 + 0x80;
  auVar36._8_2_ = sVar35 * 0x100 + 0x80;
  auVar36._10_2_ = sVar38 * 0x100 + 0x80;
  auVar36._12_2_ = sVar35 * 0x100 + 0x80;
  auVar36._14_2_ = sVar38 * 0x100 + 0x80;
  auVar41 = pshuflw(auVar18,auVar36,0);
  sVar35 = auVar41._0_2_;
  uVar70 = ((ushort)auVar18[0] * 0x100 - auVar19._0_2_) + sVar35;
  sVar38 = auVar41._2_2_;
  uVar73 = (SUB162(auVar27 << 0x18,2) - sVar20) + sVar38;
  uVar75 = (SUB162(auVar37 << 0x28,4) - sVar21) + sVar35;
  uVar77 = (auVar72._6_2_ - sVar22) + sVar38;
  uVar79 = (auVar16._8_2_ - sVar23) + sVar35;
  uVar81 = (auVar14._10_2_ - sVar24) + sVar38;
  uVar71 = uVar70 >> 8;
  uVar74 = uVar73 >> 8;
  uVar76 = uVar75 >> 8;
  uVar78 = uVar77 >> 8;
  uVar80 = uVar79 >> 8;
  uVar82 = uVar81 >> 8;
  uVar83 = (ushort)(sVar35 - sVar25) >> 8;
  uVar84 = (ushort)(sVar38 - uVar39) >> 8;
  uVar48 = ((short)iVar50 - auVar26._0_2_) + sVar35;
  uVar54 = ((short)(uVar1 >> 8) - uVar40) + sVar38;
  uVar56 = ((short)(CONCAT15(bVar29,iVar50) >> 0x20) - uVar42) + sVar35;
  uVar58 = ((short)(((ulong)bVar30 << 0x38) >> 0x30) - uVar43) + sVar38;
  uVar60 = ((short)(auVar51._0_10_ >> 0x40) - uVar44) + sVar35;
  uVar62 = (auVar51._10_2_ - uVar45) + sVar38;
  uVar64 = (auVar52._12_2_ - uVar46) + sVar35;
  uVar66 = (auVar53._14_2_ - uVar47) + sVar38;
  uVar49 = uVar48 >> 8;
  uVar55 = uVar54 >> 8;
  uVar57 = uVar56 >> 8;
  uVar59 = uVar58 >> 8;
  uVar61 = uVar60 >> 8;
  uVar63 = uVar62 >> 8;
  uVar65 = uVar64 >> 8;
  uVar67 = uVar66 >> 8;
  auVar18[1] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
  auVar18[0] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
  auVar18[2] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
  auVar18[3] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
  auVar18[4] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
  auVar18[5] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar82);
  auVar18[6] = (uVar83 != 0) * (uVar83 < 0x100) * (char)((ushort)(sVar35 - sVar25) >> 8) -
               (0xff < uVar83);
  auVar18[7] = (uVar84 != 0) * (uVar84 < 0x100) * (char)((ushort)(sVar38 - uVar39) >> 8) -
               (0xff < uVar84);
  auVar18[8] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
  auVar18[9] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
  auVar18[10] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar57);
  auVar18[0xb] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
  auVar18[0xc] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
  auVar18[0xd] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar63);
  auVar18[0xe] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65);
  auVar18[0xf] = (uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67);
  *(undefined1 (*) [16])dst = auVar18;
  auVar18 = pshuflw(auVar18,auVar36,0x55);
  auVar41._0_4_ = auVar18._0_4_;
  auVar41._4_4_ = auVar41._0_4_;
  auVar41._8_4_ = auVar41._0_4_;
  auVar41._12_4_ = auVar41._0_4_;
  sVar35 = auVar18._0_2_;
  uVar70 = auVar19._0_2_ * 0x95 + sVar35;
  sVar38 = auVar18._2_2_;
  uVar73 = sVar20 * 0x95 + sVar38;
  uVar75 = sVar21 * 0x95 + sVar35;
  uVar77 = sVar22 * 0x95 + sVar38;
  uVar79 = sVar23 * 0x95 + sVar35;
  uVar81 = sVar24 * 0x95 + sVar38;
  uVar83 = sVar25 * 0x95 + sVar35;
  uVar68 = uVar39 * 0x95 + sVar38;
  uVar71 = uVar70 >> 8;
  uVar74 = uVar73 >> 8;
  uVar76 = uVar75 >> 8;
  uVar78 = uVar77 >> 8;
  uVar80 = uVar79 >> 8;
  uVar82 = uVar81 >> 8;
  uVar84 = uVar83 >> 8;
  uVar69 = uVar68 >> 8;
  uVar48 = auVar26._0_2_ * 0x95 + sVar35;
  uVar54 = uVar40 * 0x95 + sVar38;
  uVar56 = uVar42 * 0x95 + sVar35;
  uVar58 = uVar43 * 0x95 + sVar38;
  uVar60 = uVar44 * 0x95 + sVar35;
  uVar62 = uVar45 * 0x95 + sVar38;
  uVar64 = uVar46 * 0x95 + sVar35;
  uVar66 = uVar47 * 0x95 + sVar38;
  uVar49 = uVar48 >> 8;
  uVar55 = uVar54 >> 8;
  uVar57 = uVar56 >> 8;
  uVar59 = uVar58 >> 8;
  uVar61 = uVar60 >> 8;
  uVar63 = uVar62 >> 8;
  uVar65 = uVar64 >> 8;
  uVar67 = uVar66 >> 8;
  puVar17 = dst + stride;
  *puVar17 = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
  puVar17[1] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
  puVar17[2] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
  puVar17[3] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
  puVar17[4] = (uVar80 != 0) * (uVar80 < 0x100) * (char)(uVar79 >> 8) - (0xff < uVar80);
  puVar17[5] = (uVar82 != 0) * (uVar82 < 0x100) * (char)(uVar81 >> 8) - (0xff < uVar82);
  puVar17[6] = (uVar84 != 0) * (uVar84 < 0x100) * (char)(uVar83 >> 8) - (0xff < uVar84);
  puVar17[7] = (uVar69 != 0) * (uVar69 < 0x100) * (char)(uVar68 >> 8) - (0xff < uVar69);
  puVar17[8] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
  puVar17[9] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
  puVar17[10] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar57);
  puVar17[0xb] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
  puVar17[0xc] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
  puVar17[0xd] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar63);
  puVar17[0xe] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65);
  puVar17[0xf] = (uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67);
  auVar18 = pshuflw(auVar41,auVar36,0xaa);
  sVar35 = auVar18._0_2_;
  uVar60 = auVar19._0_2_ * 0x55 + sVar35;
  sVar38 = auVar18._2_2_;
  uVar62 = sVar20 * 0x55 + sVar38;
  uVar64 = sVar21 * 0x55 + sVar35;
  uVar66 = sVar22 * 0x55 + sVar38;
  uVar70 = sVar23 * 0x55 + sVar35;
  uVar73 = sVar24 * 0x55 + sVar38;
  uVar75 = sVar25 * 0x55 + sVar35;
  uVar77 = uVar39 * 0x55 + sVar38;
  uVar61 = uVar60 >> 8;
  uVar63 = uVar62 >> 8;
  uVar65 = uVar64 >> 8;
  uVar67 = uVar66 >> 8;
  uVar71 = uVar70 >> 8;
  uVar74 = uVar73 >> 8;
  uVar76 = uVar75 >> 8;
  uVar78 = uVar77 >> 8;
  uVar39 = auVar26._0_2_ * 0x55 + sVar35;
  uVar48 = uVar40 * 0x55 + sVar38;
  uVar49 = uVar42 * 0x55 + sVar35;
  uVar54 = uVar43 * 0x55 + sVar38;
  uVar55 = uVar44 * 0x55 + sVar35;
  uVar56 = uVar45 * 0x55 + sVar38;
  uVar57 = uVar46 * 0x55 + sVar35;
  uVar58 = uVar47 * 0x55 + sVar38;
  uVar40 = uVar39 >> 8;
  uVar42 = uVar48 >> 8;
  uVar43 = uVar49 >> 8;
  uVar44 = uVar54 >> 8;
  uVar45 = uVar55 >> 8;
  uVar46 = uVar56 >> 8;
  uVar47 = uVar57 >> 8;
  uVar59 = uVar58 >> 8;
  puVar17 = dst + stride * 2;
  *puVar17 = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
  puVar17[1] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar63);
  puVar17[2] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65);
  puVar17[3] = (uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67);
  puVar17[4] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
  puVar17[5] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
  puVar17[6] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
  puVar17[7] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
  puVar17[8] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
  puVar17[9] = (uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar42);
  puVar17[10] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar43);
  puVar17[0xb] = (uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar44);
  puVar17[0xc] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar45);
  puVar17[0xd] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar46);
  puVar17[0xe] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar57 >> 8) - (0xff < uVar47);
  puVar17[0xf] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
  puVar17 = dst + stride * 3;
  auVar18 = psllw(auVar19,6);
  auVar27 = psllw(auVar26,6);
  auVar37 = pshuflw(auVar36,auVar36,0xff);
  sVar20 = auVar37._0_2_;
  uVar39 = auVar18._0_2_ + sVar20;
  sVar21 = auVar37._2_2_;
  uVar42 = auVar18._2_2_ + sVar21;
  uVar44 = auVar18._4_2_ + sVar20;
  uVar46 = auVar18._6_2_ + sVar21;
  uVar48 = auVar18._8_2_ + sVar20;
  uVar54 = auVar18._10_2_ + sVar21;
  uVar56 = auVar18._12_2_ + sVar20;
  uVar58 = auVar18._14_2_ + sVar21;
  uVar40 = uVar39 >> 8;
  uVar43 = uVar42 >> 8;
  uVar45 = uVar44 >> 8;
  uVar47 = uVar46 >> 8;
  uVar49 = uVar48 >> 8;
  uVar55 = uVar54 >> 8;
  uVar57 = uVar56 >> 8;
  uVar59 = uVar58 >> 8;
  uVar60 = auVar27._0_2_ + sVar20;
  uVar62 = auVar27._2_2_ + sVar21;
  uVar64 = auVar27._4_2_ + sVar20;
  uVar66 = auVar27._6_2_ + sVar21;
  uVar70 = auVar27._8_2_ + sVar20;
  uVar73 = auVar27._10_2_ + sVar21;
  uVar75 = auVar27._12_2_ + sVar20;
  uVar77 = auVar27._14_2_ + sVar21;
  uVar61 = uVar60 >> 8;
  uVar63 = uVar62 >> 8;
  uVar65 = uVar64 >> 8;
  uVar67 = uVar66 >> 8;
  uVar71 = uVar70 >> 8;
  uVar74 = uVar73 >> 8;
  uVar76 = uVar75 >> 8;
  uVar78 = uVar77 >> 8;
  *puVar17 = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
  puVar17[1] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8) - (0xff < uVar43);
  puVar17[2] = (uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar45);
  puVar17[3] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
  puVar17[4] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49);
  puVar17[5] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar54 >> 8) - (0xff < uVar55);
  puVar17[6] = (uVar57 != 0) * (uVar57 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar57);
  puVar17[7] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
  puVar17[8] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar60 >> 8) - (0xff < uVar61);
  puVar17[9] = (uVar63 != 0) * (uVar63 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar63);
  puVar17[10] = (uVar65 != 0) * (uVar65 < 0x100) * (char)(uVar64 >> 8) - (0xff < uVar65);
  puVar17[0xb] = (uVar67 != 0) * (uVar67 < 0x100) * (char)(uVar66 >> 8) - (0xff < uVar67);
  puVar17[0xc] = (uVar71 != 0) * (uVar71 < 0x100) * (char)(uVar70 >> 8) - (0xff < uVar71);
  puVar17[0xd] = (uVar74 != 0) * (uVar74 < 0x100) * (char)(uVar73 >> 8) - (0xff < uVar74);
  puVar17[0xe] = (uVar76 != 0) * (uVar76 < 0x100) * (char)(uVar75 >> 8) - (0xff < uVar76);
  puVar17[0xf] = (uVar78 != 0) * (uVar78 < 0x100) * (char)(uVar77 >> 8) - (0xff < uVar78);
  return;
}

Assistant:

void aom_smooth_v_predictor_16x4_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[3]);
  const __m128i weights = cvtepu8_epi16(Load4(smooth_weights));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_bottom_left =
      _mm_mullo_epi16(inverted_weights, bottom_left);
  const __m128i round = _mm_set1_epi16(128);
  const __m128i top = LoadUnaligned16(top_row);
  const __m128i top_lo = cvtepu8_epi16(top);
  const __m128i top_hi = cvtepu8_epi16(_mm_srli_si128(top, 8));

  __m128i y_select = _mm_set1_epi32(0x01000100);
  __m128i weights_y = _mm_shuffle_epi8(weights, y_select);
  __m128i scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
  dst += stride;
  y_select = _mm_set1_epi32(0x03020302);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
  dst += stride;
  y_select = _mm_set1_epi32(0x05040504);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
  dst += stride;
  y_select = _mm_set1_epi32(0x07060706);
  weights_y = _mm_shuffle_epi8(weights, y_select);
  scaled_bottom_left_y = _mm_shuffle_epi8(scaled_bottom_left, y_select);
  write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                 scaled_bottom_left_y, scaled_bottom_left_y,
                                 round);
}